

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.h
# Opt level: O3

QByteArray * operator+=(QByteArray *a,DecodedData<const_QString_&> *b)

{
  ArrayOptions *pAVar1;
  Interface *pIVar2;
  QStringEncoder *pQVar3;
  qsizetype qVar4;
  Data *pDVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  QStringView QVar10;
  
  lVar8 = (a->d).size;
  pIVar2 = (b->encoder->super_QStringConverter).iface;
  if (pIVar2 == (Interface *)0x0) {
    qVar4 = 0;
  }
  else {
    qVar4 = (*pIVar2->fromUtf16Len)((b->data->d).size);
  }
  lVar8 = qVar4 + lVar8;
  pDVar5 = (a->d).d;
  if (((pDVar5 == (Data *)0x0) ||
      (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     (lVar7 = (pDVar5->super_QArrayData).alloc,
     (long)((((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) + lVar7) -
           (long)(a->d).ptr) < lVar8)) {
    lVar7 = (a->d).size;
    if (lVar8 < lVar7) {
      lVar8 = lVar7;
    }
    QByteArray::reallocData(a,lVar8,KeepSize);
    pDVar5 = (a->d).d;
    if (pDVar5 != (Data *)0x0) {
      lVar7 = (pDVar5->super_QArrayData).alloc;
      goto LAB_0043023d;
    }
  }
  else {
LAB_0043023d:
    if (lVar7 != 0) {
      pAVar1 = &(pDVar5->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_0043025e;
  }
  QByteArray::reallocData(a,(a->d).size,KeepSize);
LAB_0043025e:
  pcVar6 = (a->d).ptr;
  pcVar9 = pcVar6 + (a->d).size;
  pQVar3 = b->encoder;
  pIVar2 = (pQVar3->super_QStringConverter).iface;
  if (pIVar2 == (Interface *)0x0) {
    (pQVar3->super_QStringConverter).state.invalidChars = 1;
  }
  else {
    QVar10.m_data = (b->data->d).ptr;
    QVar10.m_size = (b->data->d).size;
    pcVar9 = (*pIVar2->fromUtf16)(pcVar9,QVar10,&(pQVar3->super_QStringConverter).state);
    pcVar6 = (a->d).ptr;
  }
  if (pcVar6 == (char *)0x0) {
    pcVar6 = &QByteArray::_empty;
  }
  QByteArray::resize(a,(long)pcVar9 - (long)pcVar6);
  return a;
}

Assistant:

QByteArray &operator+=(QByteArray &a, const QStringEncoder::DecodedData<T> &b)
{
    qsizetype len = a.size() + QConcatenable<QStringEncoder::DecodedData<T>>::size(b);
    a.reserve(len);
    char *it = a.data() + a.size();
    QConcatenable<QStringEncoder::DecodedData<T>>::appendTo(b, it);
    a.resize(qsizetype(it - a.constData())); //may be smaller than len
    return a;
}